

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_desired_capabilities(ATTACH_HANDLE attach,AMQP_VALUE desired_capabilities_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE desired_capabilities_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  AMQP_VALUE desired_capabilities_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x1462;
  }
  else {
    if (desired_capabilities_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(desired_capabilities_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      attach_instance._4_4_ = 0x1472;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,0xc,local_30);
      if (iVar1 == 0) {
        attach_instance._4_4_ = 0;
      }
      else {
        attach_instance._4_4_ = 0x1478;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_set_desired_capabilities(ATTACH_HANDLE attach, AMQP_VALUE desired_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE desired_capabilities_amqp_value;
        if (desired_capabilities_value == NULL)
        {
            desired_capabilities_amqp_value = NULL;
        }
        else
        {
            desired_capabilities_amqp_value = amqpvalue_clone(desired_capabilities_value);
        }
        if (desired_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 12, desired_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(desired_capabilities_amqp_value);
        }
    }

    return result;
}